

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

AnyCellmlElementPtr __thiscall
libcellml::Annotator::AnnotatorImpl::convertToWeak(AnnotatorImpl *this,AnyCellmlElementPtr *item)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CellmlElementType CVar2;
  element_type *peVar3;
  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  AnyCellmlElementPtr AVar5;
  shared_ptr<libcellml::Variable> local_118;
  undefined1 local_108 [8];
  VariableWeakPtr weakVariable;
  undefined1 local_e8 [8];
  UnitsWeakPtr weakUnits;
  shared_ptr<libcellml::Reset> local_c8;
  undefined1 local_b8 [8];
  ResetWeakPtr weakReset;
  undefined1 local_98 [8];
  ImportSourceWeakPtr weakImportSource;
  undefined1 local_78 [8];
  ModelWeakPtr weakModel;
  shared_ptr<libcellml::Component> local_58;
  undefined1 local_48 [8];
  ComponentWeakPtr weakComponent;
  CellmlElementType type;
  AnyCellmlElementPtr *item_local;
  AnnotatorImpl *this_local;
  AnyCellmlElementPtr *converted;
  
  AnyCellmlElement::AnyCellmlElementImpl::create();
  peVar3 = std::
           __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  CVar2 = AnyCellmlElement::type(peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->mPimpl->mType = CVar2;
  peVar3 = std::
           __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  CVar2 = AnyCellmlElement::type(peVar3);
  switch(CVar2) {
  case COMPONENT:
  case COMPONENT_REF:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::component((AnyCellmlElement *)&local_58);
    std::weak_ptr<libcellml::Component>::weak_ptr<libcellml::Component,void>
              ((weak_ptr<libcellml::Component> *)local_48,&local_58);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_58);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,(weak_ptr<libcellml::Component> *)local_48);
    std::weak_ptr<libcellml::Component>::~weak_ptr((weak_ptr<libcellml::Component> *)local_48);
    _Var4._M_pi = extraout_RDX;
    break;
  case CONNECTION:
  case MAP_VARIABLES:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::variablePair
              ((AnyCellmlElement *)
               &weakModel.super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,
                        (shared_ptr<libcellml::VariablePair> *)
                        &weakModel.super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::shared_ptr<libcellml::VariablePair>::~shared_ptr
              ((shared_ptr<libcellml::VariablePair> *)
               &weakModel.super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    _Var4._M_pi = extraout_RDX_00;
    break;
  case ENCAPSULATION:
  case MODEL:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::model
              ((AnyCellmlElement *)
               &weakImportSource.
                super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var1 = &weakImportSource.super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    std::weak_ptr<libcellml::Model>::weak_ptr<libcellml::Model,void>
              ((weak_ptr<libcellml::Model> *)local_78,(shared_ptr<libcellml::Model> *)p_Var1);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)p_Var1);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,(weak_ptr<libcellml::Model> *)local_78);
    std::weak_ptr<libcellml::Model>::~weak_ptr((weak_ptr<libcellml::Model> *)local_78);
    _Var4._M_pi = extraout_RDX_01;
    break;
  case IMPORT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::importSource
              ((AnyCellmlElement *)
               &weakReset.super___weak_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    p_Var1 = &weakReset.super___weak_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::weak_ptr<libcellml::ImportSource>::weak_ptr<libcellml::ImportSource,void>
              ((weak_ptr<libcellml::ImportSource> *)local_98,
               (shared_ptr<libcellml::ImportSource> *)p_Var1);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)p_Var1);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,(weak_ptr<libcellml::ImportSource> *)local_98);
    std::weak_ptr<libcellml::ImportSource>::~weak_ptr((weak_ptr<libcellml::ImportSource> *)local_98)
    ;
    _Var4._M_pi = extraout_RDX_02;
    break;
  default:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::variable((AnyCellmlElement *)&local_118);
    std::weak_ptr<libcellml::Variable>::weak_ptr<libcellml::Variable,void>
              ((weak_ptr<libcellml::Variable> *)local_108,&local_118);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_118);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,(weak_ptr<libcellml::Variable> *)local_108);
    std::weak_ptr<libcellml::Variable>::~weak_ptr((weak_ptr<libcellml::Variable> *)local_108);
    _Var4._M_pi = extraout_RDX_06;
    break;
  case RESET:
  case RESET_VALUE:
  case TEST_VALUE:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::reset((AnyCellmlElement *)&local_c8);
    std::weak_ptr<libcellml::Reset>::weak_ptr<libcellml::Reset,void>
              ((weak_ptr<libcellml::Reset> *)local_b8,&local_c8);
    std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_c8);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,(weak_ptr<libcellml::Reset> *)local_b8);
    std::weak_ptr<libcellml::Reset>::~weak_ptr((weak_ptr<libcellml::Reset> *)local_b8);
    _Var4._M_pi = extraout_RDX_03;
    break;
  case UNIT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::unitsItem
              ((AnyCellmlElement *)
               &weakUnits.super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,
                        (shared_ptr<libcellml::UnitsItem> *)
                        &weakUnits.super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::shared_ptr<libcellml::UnitsItem>::~shared_ptr
              ((shared_ptr<libcellml::UnitsItem> *)
               &weakUnits.super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    _Var4._M_pi = extraout_RDX_04;
    break;
  case UNITS:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::units
              ((AnyCellmlElement *)
               &weakVariable.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var1 = &weakVariable.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::weak_ptr<libcellml::Units>::weak_ptr<libcellml::Units,void>
              ((weak_ptr<libcellml::Units> *)local_e8,(shared_ptr<libcellml::Units> *)p_Var1);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)p_Var1);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::any::operator=(&peVar3->mPimpl->mItem,(weak_ptr<libcellml::Units> *)local_e8);
    std::weak_ptr<libcellml::Units>::~weak_ptr((weak_ptr<libcellml::Units> *)local_e8);
    _Var4._M_pi = extraout_RDX_05;
  }
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::AnnotatorImpl::convertToWeak(const AnyCellmlElementPtr &item)
{
    auto converted = AnyCellmlElement::AnyCellmlElementImpl::create();
    auto type = item->type();

    converted->mPimpl->mType = type;

    switch (item->type()) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF: {
        ComponentWeakPtr weakComponent = item->component();
        converted->mPimpl->mItem = weakComponent;
    } break;
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
        // We don't store a weak pointer for connections / map variables because
        // the map is the owner of the VariablePair object.
        converted->mPimpl->mItem = item->variablePair();
        break;
    case CellmlElementType::ENCAPSULATION:
    case CellmlElementType::MODEL: {
        ModelWeakPtr weakModel = item->model();
        converted->mPimpl->mItem = weakModel;
    } break;
    case CellmlElementType::IMPORT: {
        ImportSourceWeakPtr weakImportSource = item->importSource();
        converted->mPimpl->mItem = weakImportSource;
    } break;
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE: {
        ResetWeakPtr weakReset = item->reset();
        converted->mPimpl->mItem = weakReset;
    } break;
    case CellmlElementType::UNIT:
        // We don't store a weak pointer for units item because the map is the
        // owner of the UnitsItem object.
        converted->mPimpl->mItem = item->unitsItem();
        break;
    case CellmlElementType::UNITS: {
        UnitsWeakPtr weakUnits = item->units();
        converted->mPimpl->mItem = weakUnits;
    } break;
    default: { /* CellmlElementType::VARIABLE */
        VariableWeakPtr weakVariable = item->variable();
        converted->mPimpl->mItem = weakVariable;
    } break;
    }

    return converted;
}